

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O2

int __thiscall QualEngine::open(QualEngine *this,char *__file,int __oflag,...)

{
  int iVar1;
  QualSolver *pQVar2;
  Network *extraout_RAX;
  Network *pNVar3;
  SystemError *this_00;
  string local_40;
  uint local_1c;
  
  if (this->engineState != CLOSED) {
    close(this,(int)__file);
  }
  this->network = (Network *)__file;
  iVar1 = Network::count((Network *)__file,NODE);
  this->nodeCount = iVar1;
  iVar1 = Network::count(this->network,LINK);
  this->linkCount = iVar1;
  Network::createQualModel(this->network);
  pNVar3 = this->network;
  if (pNVar3->qualModel == (QualModel *)0x0) {
    this->qualSolver = (QualSolver *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_40,"LTD",(allocator *)&local_1c);
    pQVar2 = QualSolver::factory(&local_40,this->network);
    this->qualSolver = pQVar2;
    std::__cxx11::string::~string((string *)&local_40);
    if (this->qualSolver == (QualSolver *)0x0) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x30);
      SystemError::SystemError(this_00,8);
      __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
    }
    local_1c = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->sortedLinks,(long)this->linkCount,(value_type_conflict1 *)&local_1c);
    local_1c = local_1c & 0xffffff00;
    std::vector<char,_std::allocator<char>_>::resize
              (&this->flowDirection,(long)this->linkCount,(value_type *)&local_1c);
    this->engineState = OPENED;
    pNVar3 = extraout_RAX;
  }
  return (int)pNVar3;
}

Assistant:

void QualEngine::open(Network* nw)
{
    // ... close currently open engine

    if (engineState != QualEngine::CLOSED) close();

    // ... assign network to engine

    network = nw;
    nodeCount = network->count(Element::NODE);
    linkCount = network->count(Element::LINK);

    // ... create a water quality reaction model

    network->createQualModel();

    // ... no quality solver if there's no network quality model

    if ( network->qualModel == nullptr )
    {
        qualSolver = nullptr;
        return;
    }

    // ... create a water quality solver

    qualSolver = QualSolver::factory("LTD", network);
    if (!qualSolver) throw SystemError(SystemError::QUALITY_SOLVER_NOT_OPENED);

    // ... create sorted link & flow direction arrays

    try
    {
	    sortedLinks.resize(linkCount, 0);
        flowDirection.resize(linkCount, 0);
        engineState = QualEngine::OPENED;
    }
    catch (...)
    {
        throw SystemError(SystemError::QUALITY_SOLVER_NOT_OPENED);
    }
}